

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteFlushLeaf(Fts5Index *p,Fts5SegWriter *pWriter)

{
  Fts5PageWriter *pFVar1;
  i64 iRowid;
  Fts5PageWriter *pPage;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  pFVar1 = &pWriter->writer;
  fts5PutU16((pWriter->writer).buf.p + 2,(u16)(pWriter->writer).buf.n);
  if (pWriter->bFirstTermInPage == '\0') {
    sqlite3Fts5BufferAppendBlob
              (&p->rc,&(pWriter->writer).buf,(pWriter->writer).pgidx.n,(pWriter->writer).pgidx.p);
  }
  else {
    fts5WriteBtreeNoTerm(p,pWriter);
  }
  fts5DataWrite(p,((long)pWriter->iSegid << 0x25) + (long)pFVar1->pgno,(pWriter->writer).buf.p,
                (pWriter->writer).buf.n);
  sqlite3Fts5BufferZero(&(pWriter->writer).buf);
  sqlite3Fts5BufferZero(&(pWriter->writer).pgidx);
  sqlite3Fts5BufferAppendBlob(&p->rc,&(pWriter->writer).buf,4,"");
  (pWriter->writer).iPrevPgidx = 0;
  pFVar1->pgno = pFVar1->pgno + 1;
  pWriter->nLeafWritten = pWriter->nLeafWritten + 1;
  pWriter->bFirstTermInPage = '\x01';
  pWriter->bFirstRowidInPage = '\x01';
  return;
}

Assistant:

static void fts5WriteFlushLeaf(Fts5Index *p, Fts5SegWriter *pWriter){
  static const u8 zero[] = { 0x00, 0x00, 0x00, 0x00 };
  Fts5PageWriter *pPage = &pWriter->writer;
  i64 iRowid;

  assert( (pPage->pgidx.n==0)==(pWriter->bFirstTermInPage) );

  /* Set the szLeaf header field. */
  assert( 0==fts5GetU16(&pPage->buf.p[2]) );
  fts5PutU16(&pPage->buf.p[2], (u16)pPage->buf.n);

  if( pWriter->bFirstTermInPage ){
    /* No term was written to this page. */
    assert( pPage->pgidx.n==0 );
    fts5WriteBtreeNoTerm(p, pWriter);
  }else{
    /* Append the pgidx to the page buffer. Set the szLeaf header field. */
    fts5BufferAppendBlob(&p->rc, &pPage->buf, pPage->pgidx.n, pPage->pgidx.p);
  }

  /* Write the page out to disk */
  iRowid = FTS5_SEGMENT_ROWID(pWriter->iSegid, pPage->pgno);
  fts5DataWrite(p, iRowid, pPage->buf.p, pPage->buf.n);

  /* Initialize the next page. */
  fts5BufferZero(&pPage->buf);
  fts5BufferZero(&pPage->pgidx);
  fts5BufferAppendBlob(&p->rc, &pPage->buf, 4, zero);
  pPage->iPrevPgidx = 0;
  pPage->pgno++;

  /* Increase the leaves written counter */
  pWriter->nLeafWritten++;

  /* The new leaf holds no terms or rowids */
  pWriter->bFirstTermInPage = 1;
  pWriter->bFirstRowidInPage = 1;
}